

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O1

void SoftForkDescPushBack
               (CBlockIndex *blockindex,UniValue *softforks,ChainstateManager *chainman,
               BuriedDeployment dep)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CChainParams *pCVar2;
  string key;
  string key_00;
  string key_01;
  string key_02;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  size_type sVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer pUVar7;
  pointer pUVar8;
  pointer pUVar9;
  bool bVar10;
  int iVar11;
  long in_FS_OFFSET;
  UniValue rv;
  undefined8 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  undefined8 in_stack_fffffffffffffd78;
  _Alloc_hider _Var12;
  undefined8 in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  undefined8 uVar13;
  undefined8 in_stack_fffffffffffffd90;
  pointer in_stack_fffffffffffffd98;
  pointer in_stack_fffffffffffffda0;
  pointer in_stack_fffffffffffffda8;
  pointer in_stack_fffffffffffffdb0;
  pointer in_stack_fffffffffffffdb8;
  pointer in_stack_fffffffffffffdc0;
  _Alloc_hider in_stack_fffffffffffffdc8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  UniValue local_218;
  long *local_1c0 [2];
  long local_1b0 [2];
  UniValue local_1a0;
  long *local_148 [2];
  long local_138 [2];
  UniValue local_128;
  long *local_d0 [2];
  long local_c0 [2];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [9];
  undefined4 local_97;
  undefined2 local_93;
  char local_91;
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar10 = DeploymentEnabled<Consensus::BuriedDeployment>(chainman,dep);
  if (bVar10) {
    local_b0 = local_a0;
    local_a8 = 0;
    paVar1 = &local_90.val.field_2;
    local_90.typ = VOBJ;
    local_90.val.field_2._M_local_buf[0] = '\0';
    local_90.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_a0._1_8_;
    local_90.val.field_2._M_local_buf[8] = SUB81(local_a0._1_8_,7);
    local_90.val.field_2._9_4_ = local_97;
    local_90.val.field_2._13_2_ = local_93;
    local_90.val.field_2._M_local_buf[0xf] = local_91;
    local_90.val._M_string_length = 0;
    local_a0[0] = 0;
    local_90.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d0[0] = local_c0;
    local_90.val._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"type","");
    UniValue::UniValue<const_char_(&)[7],_char[7],_true>(&local_128,(char (*) [7])"buried");
    key._M_string_length = (size_type)softforks;
    key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd58;
    key.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffd68;
    key.field_2._M_allocated_capacity._4_4_ = in_stack_fffffffffffffd6c;
    key.field_2._8_4_ = in_stack_fffffffffffffd70;
    key.field_2._12_4_ = in_stack_fffffffffffffd74;
    val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd80;
    val._0_8_ = in_stack_fffffffffffffd78;
    val.val._M_string_length = in_stack_fffffffffffffd88;
    val.val.field_2._M_allocated_capacity = in_stack_fffffffffffffd90;
    val.val.field_2._8_8_ = in_stack_fffffffffffffd98;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffda0;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = in_stack_fffffffffffffda8;
    val.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffdb0;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_fffffffffffffdb8;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_fffffffffffffdc0;
    val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffdc8._M_p;
    UniValue::pushKV(&local_90,key,val);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_128.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_128.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.val._M_dataplus._M_p != &local_128.val.field_2) {
      operator_delete(local_128.val._M_dataplus._M_p,local_128.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0],local_c0[0] + 1);
    }
    local_148[0] = local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"active","");
    bVar10 = DeploymentActiveAfter<Consensus::BuriedDeployment>(blockindex,chainman,dep);
    iVar11 = CONCAT31((int3)((uint)in_stack_fffffffffffffd6c >> 8),bVar10);
    UniValue::UniValue<bool,_bool,_true>(&local_1a0,(bool *)&stack0xfffffffffffffd6c);
    key_00._M_string_length = (size_type)softforks;
    key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd58;
    key_00.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffd68;
    key_00.field_2._M_allocated_capacity._4_4_ = iVar11;
    key_00.field_2._8_4_ = in_stack_fffffffffffffd70;
    key_00.field_2._12_4_ = in_stack_fffffffffffffd74;
    val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd80;
    val_00._0_8_ = in_stack_fffffffffffffd78;
    val_00.val._M_string_length = in_stack_fffffffffffffd88;
    val_00.val.field_2._M_allocated_capacity = in_stack_fffffffffffffd90;
    val_00.val.field_2._8_8_ = in_stack_fffffffffffffd98;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffda0;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = in_stack_fffffffffffffda8;
    val_00.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffdb0;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_fffffffffffffdb8;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_fffffffffffffdc0;
    val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffdc8._M_p;
    UniValue::pushKV(&local_90,key_00,val_00);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1a0.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1a0.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a0.val._M_dataplus._M_p != &local_1a0.val.field_2) {
      operator_delete(local_1a0.val._M_dataplus._M_p,local_1a0.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_148[0] != local_138) {
      operator_delete(local_148[0],local_138[0] + 1);
    }
    local_1c0[0] = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"height","");
    if ((int)dep + 0x8000U < 5) {
      pCVar2 = (chainman->m_options).chainparams;
      switch((int)dep) {
      case -0x8000:
        iVar11 = (pCVar2->consensus).BIP34Height;
        break;
      case -0x7fff:
        iVar11 = (pCVar2->consensus).BIP65Height;
        break;
      case -0x7ffe:
        iVar11 = (pCVar2->consensus).BIP66Height;
        break;
      case -0x7ffd:
        iVar11 = (pCVar2->consensus).CSVHeight;
        break;
      case -0x7ffc:
        iVar11 = (pCVar2->consensus).SegwitHeight;
      }
    }
    else {
      iVar11 = 0x7fffffff;
    }
    UniValue::UniValue<int,_int,_true>(&local_218,(int *)&stack0xfffffffffffffd6c);
    key_01._M_string_length = (size_type)softforks;
    key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd58;
    key_01.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffd68;
    key_01.field_2._M_allocated_capacity._4_4_ = iVar11;
    key_01.field_2._8_4_ = in_stack_fffffffffffffd70;
    key_01.field_2._12_4_ = in_stack_fffffffffffffd74;
    val_01.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd80;
    val_01._0_8_ = in_stack_fffffffffffffd78;
    val_01.val._M_string_length = in_stack_fffffffffffffd88;
    val_01.val.field_2._M_allocated_capacity = in_stack_fffffffffffffd90;
    val_01.val.field_2._8_8_ = in_stack_fffffffffffffd98;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffffda0;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = in_stack_fffffffffffffda8;
    val_01.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffdb0;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_fffffffffffffdb8;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_fffffffffffffdc0;
    val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffdc8._M_p;
    UniValue::pushKV(&local_90,key_01,val_01);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_218.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_218.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218.val._M_dataplus._M_p != &local_218.val.field_2) {
      operator_delete(local_218.val._M_dataplus._M_p,local_218.val.field_2._M_allocated_capacity + 1
                     );
    }
    if (local_1c0[0] != local_1b0) {
      operator_delete(local_1c0[0],local_1b0[0] + 1);
    }
    DeploymentName_abi_cxx11_((string *)&stack0xfffffffffffffdc8,dep);
    pUVar9 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pUVar8 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pUVar7 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
             super__Vector_impl_data._M_start;
    pbVar6 = local_90.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    pbVar5 = local_90.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = local_90.keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar3 = local_90.val._M_string_length;
    _Var12._M_p = local_90.val._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.val._M_dataplus._M_p == paVar1) {
      in_stack_fffffffffffffd90 =
           CONCAT17(local_90.val.field_2._M_local_buf[0xf],
                    CONCAT25(local_90.val.field_2._13_2_,
                             CONCAT41(local_90.val.field_2._9_4_,
                                      local_90.val.field_2._M_local_buf[8])));
      _Var12._M_p = (pointer)&stack0xfffffffffffffd88;
    }
    uVar13._1_7_ = local_90.val.field_2._M_allocated_capacity._1_7_;
    uVar13._0_1_ = local_90.val.field_2._M_local_buf[0];
    local_90.val._M_string_length = 0;
    local_90.val.field_2._M_local_buf[0] = '\0';
    local_90.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    key_02._M_string_length = (size_type)softforks;
    key_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd58;
    key_02.field_2._M_allocated_capacity._0_4_ = in_stack_fffffffffffffd68;
    key_02.field_2._M_allocated_capacity._4_4_ = iVar11;
    key_02.field_2._8_4_ = local_90.typ;
    key_02.field_2._12_4_ = in_stack_fffffffffffffd74;
    val_02.val._M_dataplus._M_p = (pointer)sVar3;
    val_02._0_8_ = _Var12._M_p;
    val_02.val._M_string_length = uVar13;
    val_02.val.field_2._M_allocated_capacity = in_stack_fffffffffffffd90;
    val_02.val.field_2._8_8_ = pbVar4;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pbVar5;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar6;
    val_02.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pUVar7;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = pUVar8;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = pUVar9;
    val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffdc8._M_p;
    local_90.val._M_dataplus._M_p = (pointer)paVar1;
    UniValue::pushKV(softforks,key_02,val_02);
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector
              ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffdb0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&stack0xfffffffffffffd98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var12._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)&stack0xfffffffffffffd88) {
      operator_delete(_Var12._M_p,uVar13 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffdc8._M_p != &local_228) {
      operator_delete(in_stack_fffffffffffffdc8._M_p,local_228._M_allocated_capacity + 1);
    }
    std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_90.keys);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.val._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.val._M_dataplus._M_p,
                      CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                               local_90.val.field_2._M_local_buf[0]) + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void SoftForkDescPushBack(const CBlockIndex* blockindex, UniValue& softforks, const ChainstateManager& chainman, Consensus::BuriedDeployment dep)
{
    // For buried deployments.

    if (!DeploymentEnabled(chainman, dep)) return;

    UniValue rv(UniValue::VOBJ);
    rv.pushKV("type", "buried");
    // getdeploymentinfo reports the softfork as active from when the chain height is
    // one below the activation height
    rv.pushKV("active", DeploymentActiveAfter(blockindex, chainman, dep));
    rv.pushKV("height", chainman.GetConsensus().DeploymentHeight(dep));
    softforks.pushKV(DeploymentName(dep), std::move(rv));
}